

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::debugging_internal::ParseUnnamedTypeName(State *state)

{
  ParseState *pPVar1;
  undefined1 *puVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  char *str;
  int which;
  int local_34;
  undefined8 local_30;
  int local_28;
  
  iVar6 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar6 + 1;
  state->steps = iVar3 + 1;
  if (0x1ffff < iVar3 || 0xff < iVar6) {
    bVar5 = false;
    goto LAB_0027375c;
  }
  local_28 = (state->parse_state).prev_name_idx;
  local_30._0_4_ = (state->parse_state).mangled_idx;
  local_30._4_4_ = (state->parse_state).out_cur_idx;
  uVar4 = *(uint *)&(state->parse_state).field_0xc;
  local_34 = -1;
  bVar5 = ParseTwoCharToken(state,"Ut");
  if (bVar5) {
    ParseNumber(state,&local_34);
    if (0x7ffffffd < local_34) goto LAB_00273689;
    bVar5 = ParseOneCharToken(state,'_');
    if (!bVar5) goto LAB_00273689;
    str = "{unnamed type#";
LAB_0027365c:
    MaybeAppend(state,str);
    MaybeAppendDecimal(state,local_34 + 2);
    MaybeAppend(state,"}");
    bVar5 = true;
  }
  else {
LAB_00273689:
    pPVar1 = &state->parse_state;
    (state->parse_state).prev_name_idx = local_28;
    pPVar1->mangled_idx = (undefined4)local_30;
    pPVar1->out_cur_idx = local_30._4_4_;
    *(uint *)&(state->parse_state).field_0xc = uVar4;
    local_34 = -1;
    bVar5 = ParseTwoCharToken(state,"Ul");
    if (bVar5) {
      puVar2 = &(state->parse_state).field_0xf;
      *puVar2 = *puVar2 & 0x7f;
      do {
        bVar5 = ParseTemplateParamDecl(state);
      } while (bVar5);
      bVar5 = ParseType(state);
      if (bVar5) {
        do {
          bVar5 = ParseType(state);
        } while (bVar5);
        *(uint *)&(state->parse_state).field_0xc =
             *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar4 & 0x80000000;
        bVar5 = ParseOneCharToken(state,'E');
        if (bVar5) {
          ParseNumber(state,&local_34);
          if (local_34 < 0x7ffffffe) {
            bVar5 = ParseOneCharToken(state,'_');
            if (bVar5) {
              str = "{lambda()#";
              goto LAB_0027365c;
            }
          }
        }
      }
    }
    (state->parse_state).prev_name_idx = local_28;
    pPVar1->mangled_idx = (undefined4)local_30;
    pPVar1->out_cur_idx = local_30._4_4_;
    *(uint *)&(state->parse_state).field_0xc = uVar4;
    bVar5 = false;
  }
  iVar6 = state->recursion_depth + -1;
LAB_0027375c:
  state->recursion_depth = iVar6;
  return bVar5;
}

Assistant:

static bool ParseUnnamedTypeName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  // Type's 1-based index n is encoded as { "", n == 1; itoa(n-2), otherwise }.
  // Optionally parse the encoded value into 'which' and add 2 to get the index.
  int which = -1;

  // Unnamed type local to function or class.
  if (ParseTwoCharToken(state, "Ut") && Optional(ParseNumber(state, &which)) &&
      which <= std::numeric_limits<int>::max() - 2 &&  // Don't overflow.
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "{unnamed type#");
    MaybeAppendDecimal(state, 2 + which);
    MaybeAppend(state, "}");
    return true;
  }
  state->parse_state = copy;

  // Closure type.
  which = -1;
  if (ParseTwoCharToken(state, "Ul") && DisableAppend(state) &&
      ZeroOrMore(ParseTemplateParamDecl, state) &&
      OneOrMore(ParseType, state) && RestoreAppend(state, copy.append) &&
      ParseOneCharToken(state, 'E') && Optional(ParseNumber(state, &which)) &&
      which <= std::numeric_limits<int>::max() - 2 &&  // Don't overflow.
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "{lambda()#");
    MaybeAppendDecimal(state, 2 + which);
    MaybeAppend(state, "}");
    return true;
  }
  state->parse_state = copy;

  return false;
}